

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiMemoryLowering.cpp
# Opt level: O1

Expression * __thiscall
wasm::MultiMemoryLowering::Replacer::makeDataSegmentBoundsCheck
          (Replacer *this,MemoryInit *curr,Index sizeIdx,Index offsetIdx)

{
  uintptr_t uVar1;
  DataSegment *pDVar2;
  Expression *pEVar3;
  Expression *rightOperand;
  Const *limit;
  
  pDVar2 = Module::getDataSegment(this->parent->wasm,(Name)(curr->segment).super_IString.str);
  uVar1 = (this->parent->pointerType).id;
  pEVar3 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x18,8);
  pEVar3->_id = LocalGetId;
  pEVar3[1]._id = offsetIdx;
  (pEVar3->type).id = uVar1;
  uVar1 = (this->parent->pointerType).id;
  rightOperand = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x18,8);
  rightOperand->_id = LocalGetId;
  rightOperand[1]._id = sizeIdx;
  (rightOperand->type).id = uVar1;
  limit = Builder::makeConstPtr
                    (&this->builder,
                     (long)(pDVar2->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(pDVar2->data).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start,(Type)(this->parent->pointerType).id);
  pEVar3 = makeAddGtuTrap(this,pEVar3,rightOperand,(Expression *)limit);
  return pEVar3;
}

Assistant:

Expression* makeDataSegmentBoundsCheck(MemoryInit* curr,
                                           Index sizeIdx,
                                           Index offsetIdx) {
      auto* segment = parent.wasm->getDataSegment(curr->segment);
      Expression* addGtuTrap = makeAddGtuTrap(
        builder.makeLocalGet(offsetIdx, parent.pointerType),
        builder.makeLocalGet(sizeIdx, parent.pointerType),
        builder.makeConstPtr(segment->data.size(), parent.pointerType));
      return addGtuTrap;
    }